

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O2

bool __thiscall NJamSpell::TSpellCorrector::LoadCache(TSpellCorrector *this,string *cacheFile)

{
  unsigned_long uVar1;
  unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_> __p;
  char cVar2;
  uint64_t uVar3;
  __uniq_ptr_data<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>,_true,_true>
  this_00;
  TBloomFilter *this_01;
  bool bVar4;
  istream local_250 [8];
  ifstream in;
  unsigned_long local_48;
  uint64_t checkSum;
  uint64_t magicByte;
  unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_> deletes2;
  unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_> deletes1;
  uint16_t version;
  
  std::ifstream::ifstream(local_250,(string *)cacheFile,_S_bin);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    deletes1._M_t.
    super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>.
    _M_t.
    super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
    .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl._6_2_ = 0;
    checkSum = 0;
    NHandyPack::TPodSerializer<unsigned_long>::Load(local_250,&checkSum);
    if (checkSum == 0x34e5602a26004436) {
      NHandyPack::TPodSerializer<unsigned_short>::Load
                (local_250,
                 (unsigned_short *)
                 ((long)&deletes1._M_t.
                         super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                         .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl + 6))
      ;
      if (deletes1._M_t.
          super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
          .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl._6_2_ == 1) {
        local_48 = 0;
        NHandyPack::TPodSerializer<unsigned_long>::Load(local_250,&local_48);
        uVar1 = local_48;
        uVar3 = TLangModel::GetCheckSum(&this->LangModel);
        if (uVar1 == uVar3) {
          this_00.
          super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
          .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl =
               (__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                )operator_new(8);
          TBloomFilter::TBloomFilter
                    ((TBloomFilter *)
                     this_00.
                     super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                     .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl);
          deletes2._M_t.
          super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
          .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl =
               (__uniq_ptr_data<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>,_true,_true>
                )(__uniq_ptr_data<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>,_true,_true>
                  )this_00.
                   super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                   .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl;
          this_01 = (TBloomFilter *)operator_new(8);
          TBloomFilter::TBloomFilter(this_01);
          magicByte = (uint64_t)this_01;
          TBloomFilter::Load((TBloomFilter *)
                             deletes2._M_t.
                             super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                             .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl,
                             local_250);
          TBloomFilter::Load(this_01,local_250);
          checkSum = 0;
          NHandyPack::TPodSerializer<unsigned_long>::Load(local_250,&checkSum);
          __p = deletes2;
          bVar4 = checkSum == 0x34e5602a26004436;
          if (bVar4) {
            deletes2._M_t.
            super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
            ._M_t.
            super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
            .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl =
                 (__uniq_ptr_data<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>,_true,_true>
                  )(__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                    )0x0;
            std::
            __uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
            ::reset((__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                     *)&this->Deletes1,
                    (pointer)__p._M_t.
                             super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                             .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl);
            uVar3 = magicByte;
            magicByte = 0;
            std::
            __uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
            ::reset((__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                     *)&this->Deletes2,(pointer)uVar3);
          }
          std::unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>::
          ~unique_ptr((unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                       *)&magicByte);
          std::unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>::
          ~unique_ptr(&deletes2);
          goto LAB_00107ef4;
        }
      }
    }
  }
  bVar4 = false;
LAB_00107ef4:
  std::ifstream::~ifstream(local_250);
  return bVar4;
}

Assistant:

bool TSpellCorrector::LoadCache(const std::string& cacheFile) {
    std::ifstream in(cacheFile, std::ios::binary);
    if (!in.is_open()) {
        return false;
    }
    uint16_t version = 0;
    uint64_t magicByte = 0;
    NHandyPack::Load(in, magicByte);
    if (magicByte != SPELL_CHECKER_CACHE_MAGIC_BYTE) {
        return false;
    }
    NHandyPack::Load(in, version);
    if (version != SPELL_CHECKER_CACHE_VERSION) {
        return false;
    }
    uint64_t checkSum = 0;
    NHandyPack::Load(in, checkSum);
    if (checkSum != LangModel.GetCheckSum()) {
        return false;
    }
    std::unique_ptr<TBloomFilter> deletes1(new TBloomFilter());
    std::unique_ptr<TBloomFilter> deletes2(new TBloomFilter());
    deletes1->Load(in);
    deletes2->Load(in);
    magicByte = 0;
    NHandyPack::Load(in, magicByte);
    if (magicByte != SPELL_CHECKER_CACHE_MAGIC_BYTE) {
        return false;
    }
    Deletes1 = std::move(deletes1);
    Deletes2 = std::move(deletes2);
    return true;
}